

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgssv.c
# Opt level: O3

void dgssv(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,SuperMatrix *L,
          SuperMatrix *U,SuperMatrix *B,SuperLUStat_t *stat,int_t *info)

{
  Stype_t SVar1;
  double *pdVar2;
  int_t *piVar3;
  trans_t trans;
  int *perm_r_00;
  int iVar4;
  int relax;
  int *etree;
  int_t iVar5;
  double dVar6;
  double dVar7;
  SuperMatrix *local_108;
  int i;
  int *local_e0;
  int info1;
  SuperMatrix AC;
  GlobalLU_t Glu;
  
  *info = 0;
  if (options->Fact == DOFACT) {
    iVar4 = A->nrow;
    i = 2;
    iVar5 = -2;
    if ((((-1 < iVar4) && (iVar4 == A->ncol)) && (SVar1 = A->Stype, (SVar1 & ~SLU_NR) == SLU_NC)) &&
       ((A->Dtype == SLU_D && (A->Mtype == SLU_GE)))) {
      i = 7;
      iVar5 = -7;
      if ((((-1 < B->ncol) && ((iVar4 <= *B->Store && (B->Stype == SLU_DN)))) && (B->Dtype == SLU_D)
          ) && (B->Mtype == SLU_GE)) {
        pdVar2 = stat->utime;
        local_e0 = perm_r;
        if (SVar1 == SLU_NC) {
          trans = NOTRANS;
          local_108 = A;
        }
        else if (SVar1 == SLU_NR) {
          piVar3 = (int_t *)A->Store;
          local_108 = (SuperMatrix *)superlu_malloc(0x20);
          dCreate_CompCol_Matrix
                    (local_108,A->ncol,A->nrow,*piVar3,*(double **)(piVar3 + 2),
                     *(int_t **)(piVar3 + 4),*(int_t **)(piVar3 + 6),SLU_NC,A->Dtype,A->Mtype);
          trans = TRANS;
        }
        else {
          *info = 1;
          input_error("dgssv",&i);
          trans = NOTRANS;
          local_108 = (SuperMatrix *)0x0;
        }
        dVar6 = SuperLU_timer_();
        if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
          get_perm_c(options->ColPerm,local_108,perm_c);
        }
        dVar7 = SuperLU_timer_();
        *pdVar2 = dVar7 - dVar6;
        etree = int32Malloc(A->ncol);
        dVar6 = SuperLU_timer_();
        sp_preorder(options,local_108,perm_c,etree,&AC);
        dVar7 = SuperLU_timer_();
        pdVar2[3] = dVar7 - dVar6;
        iVar4 = sp_ienv(1);
        relax = sp_ienv(2);
        dVar6 = SuperLU_timer_();
        perm_r_00 = local_e0;
        dgstrf(options,&AC,relax,iVar4,etree,(void *)0x0,0,perm_c,local_e0,L,U,&Glu,stat,info);
        dVar7 = SuperLU_timer_();
        pdVar2[7] = dVar7 - dVar6;
        dVar6 = SuperLU_timer_();
        if (*info == 0) {
          dgstrs(trans,L,U,perm_c,perm_r_00,B,stat,&info1);
        }
        dVar7 = SuperLU_timer_();
        pdVar2[0x11] = dVar7 - dVar6;
        superlu_free(etree);
        Destroy_CompCol_Permuted(&AC);
        if (A->Stype != SLU_NR) {
          return;
        }
        Destroy_SuperMatrix_Store(local_108);
        superlu_free(local_108);
        return;
      }
    }
  }
  else {
    i = 1;
    iVar5 = -1;
  }
  *info = iVar5;
  input_error("dgssv",&i);
  return;
}

Assistant:

void
dgssv(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
      SuperMatrix *L, SuperMatrix *U, SuperMatrix *B,
      SuperLUStat_t *stat, int_t *info )
{

    DNformat *Bstore;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int      lwork = 0, *etree, i;
    GlobalLU_t Glu; /* Not needed on return. */
    
    /* Set default values for some parameters */
    int      panel_size;     /* panel size */
    int      relax;          /* no of columns in a relaxed snodes */
    int      permc_spec;
    trans_t  trans = NOTRANS;
    double   *utime;
    double   t;	/* Temporary time */

    /* Test the input parameters ... */
    *info = 0;
    Bstore = B->Store;
    if ( options->Fact != DOFACT ) *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	 (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	 A->Dtype != SLU_D || A->Mtype != SLU_GE )
	*info = -2;
    else if ( B->ncol < 0 || Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
	B->Stype != SLU_DN || B->Dtype != SLU_D || B->Mtype != SLU_GE )
	*info = -7;
    if ( *info != 0 ) {
	i = -(*info);
	input_error("dgssv", &i);
	return;
    }

    utime = stat->utime;

    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	dCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz, 
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	trans = TRANS;
    } else if ( A->Stype == SLU_NC ) {
        AA = A;
    }
    /* A is of unsupported matrix format. */
    else {
        AA = NULL;
        *info = 1;
        input_error("dgssv", &i);
    }

    t = SuperLU_timer_();
    /*
     * Get column permutation vector perm_c[], according to permc_spec:
     *   permc_spec = NATURAL:  natural ordering 
     *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
     *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
     *   permc_spec = COLAMD:   approximate minimum degree column ordering
     *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
     */
    permc_spec = options->ColPerm;
    if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
      get_perm_c(permc_spec, AA, perm_c);
    utime[COLPERM] = SuperLU_timer_() - t;

    etree = int32Malloc(A->ncol);

    t = SuperLU_timer_();
    sp_preorder(options, AA, perm_c, etree, &AC);
    utime[ETREE] = SuperLU_timer_() - t;

    panel_size = sp_ienv(1);
    relax = sp_ienv(2);

    /*printf("Factor PA = LU ... relax %d\tw %d\tmaxsuper %d\trowblk %d\n", 
	  relax, panel_size, sp_ienv(3), sp_ienv(4));*/
    t = SuperLU_timer_(); 
    /* Compute the LU factorization of A. */
    dgstrf(options, &AC, relax, panel_size, etree,
            NULL, lwork, perm_c, perm_r, L, U, &Glu, stat, info);
    utime[FACT] = SuperLU_timer_() - t;

    t = SuperLU_timer_();
    if ( *info == 0 ) {
        /* Solve the system A*X=B, overwriting B with X. */
	int info1;
        dgstrs (trans, L, U, perm_c, perm_r, B, stat, &info1);
    }
#if ( PRNTlevel>=1 )
     else {
        printf("dgstrf info %lld\n", (long long) *info); fflush(stdout);
    }
#endif
    
    utime[SOLVE] = SuperLU_timer_() - t;

    SUPERLU_FREE (etree);
    Destroy_CompCol_Permuted(&AC);
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}